

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void check_integral_opt<long,zmq::sockopt::integral_option<22,long,false>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2,
               byte param_3)

{
  MessageBuilder *pMVar1;
  long value;
  bool bVar2;
  Decomposer local_2d9;
  ExprLhs<long> local_2d8;
  enable_if_t<Detail::conjunction<Detail::is_eq_comparable<long,_long>,_capture_by_value<long>_>::value,_BinaryExpr<long,_long>_>
  local_2d0;
  StringRef local_2a0;
  SourceLineInfo local_290;
  StringRef local_280;
  undefined1 local_270 [8];
  AssertionHandler catchAssertionHandler;
  long s;
  SourceLineInfo local_1f8;
  StringRef local_1e8;
  MessageBuilder local_1d8;
  undefined1 local_180 [8];
  ScopedMessage scopedMessage18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  SourceLineInfo local_f8;
  StringRef local_e8;
  MessageBuilder local_d8;
  undefined1 local_80 [8];
  ScopedMessage scopedMessage17;
  long val;
  bool set_only_local;
  string *info_local;
  socket_t *sock_local;
  
  scopedMessage17.m_moved = true;
  scopedMessage17._73_7_ = 0;
  local_e8 = operator____catch_sr("INFO",4);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
             0xe5);
  Catch::MessageBuilder::MessageBuilder(&local_d8,local_e8,&local_f8,Info);
  std::operator+(&local_118,"setting ",param_2);
  pMVar1 = Catch::MessageBuilder::operator<<(&local_d8,&local_118);
  Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_80,pMVar1);
  std::__cxx11::string::~string((string *)&local_118);
  Catch::MessageBuilder::~MessageBuilder(&local_d8);
  zmq::detail::socket_base::set<22,long,false>(param_1,&scopedMessage17.m_moved);
  bVar2 = (param_3 & 1) == 0;
  if (bVar2) {
    local_1e8 = operator____catch_sr("INFO",4);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
               0xea);
    Catch::MessageBuilder::MessageBuilder(&local_1d8,local_1e8,&local_1f8,Info);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   "getting ",param_2);
    pMVar1 = Catch::MessageBuilder::operator<<
                       (&local_1d8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
    Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_180,pMVar1);
    std::__cxx11::string::~string((string *)&s);
    Catch::MessageBuilder::~MessageBuilder(&local_1d8);
    value = zmq::detail::socket_base::get<22,long,false>(param_1);
    local_280 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
               0xec);
    local_2a0 = operator____catch_sr("s == val",8);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_270,local_280,&local_290,local_2a0,ContinueOnFailure);
    local_2d8 = Catch::operator<=<long,_0>(&local_2d9,value);
    Catch::operator==(&local_2d0,&local_2d8,1);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_270,&local_2d0.super_ITransientExpression);
    Catch::BinaryExpr<long,_long>::~BinaryExpr(&local_2d0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_270);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_270);
    Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_180);
  }
  scopedMessage18._77_3_ = 0;
  scopedMessage18._76_1_ = !bVar2;
  Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_80);
  return;
}

Assistant:

void check_integral_opt(Opt opt,
                        zmq::socket_t &sock,
                        std::string info,
                        bool set_only = false)
{
    const T val = 1;
    INFO("setting " + info);
    sock.set(opt, val);
    if (set_only)
        return;

    INFO("getting " + info);
    auto s = sock.get(opt);
    CHECK(s == val);
}